

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

void __thiscall ON_SubD_FixedSizeHeap::Destroy(ON_SubD_FixedSizeHeap *this)

{
  ON_SubDVertex *p_00;
  ON_SubDEdge *p_01;
  ON_SubDFace *p_02;
  ON__UINT_PTR *p_03;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **p_04;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *p_05;
  void *p [6];
  ON_SubD_FixedSizeHeap *this_local;
  
  Reset(this);
  this->m_v_capacity = 0;
  this->m_e_capacity = 0;
  this->m_f_capacity = 0;
  this->m_p_capacity = 0;
  this->m_h_capacity = 0;
  this->m_h_count = 0;
  p_00 = this->m_v;
  p_01 = this->m_e;
  p_02 = this->m_f;
  p_03 = this->m_p;
  p_04 = this->m_hash_table;
  p_05 = this->m_hash_elements;
  this->m_v = (ON_SubDVertex *)0x0;
  this->m_e = (ON_SubDEdge *)0x0;
  this->m_f = (ON_SubDFace *)0x0;
  this->m_p = (ON__UINT_PTR *)0x0;
  this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
  this->m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0;
  ON_SubD__Free(p_00);
  ON_SubD__Free(p_01);
  ON_SubD__Free(p_02);
  ON_SubD__Free(p_03);
  ON_SubD__Free(p_04);
  ON_SubD__Free(p_05);
  return;
}

Assistant:

void ON_SubD_FixedSizeHeap::Destroy()
{
  Reset();
  m_v_capacity = 0;
  m_e_capacity = 0;
  m_f_capacity = 0;
  m_p_capacity = 0;
  m_h_capacity = 0;
  m_h_count = 0;
  void* p[6] = { m_v, m_e, m_f, m_p, m_hash_table, m_hash_elements };
  m_v = nullptr;
  m_e = nullptr;
  m_f = nullptr;
  m_p = nullptr;
  m_hash_table = nullptr;
  m_hash_elements = nullptr;
  ON_SubD__Free(p[0]);
  ON_SubD__Free(p[1]);
  ON_SubD__Free(p[2]);
  ON_SubD__Free(p[3]);
  ON_SubD__Free(p[4]);
  ON_SubD__Free(p[5]);
}